

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  TRef TVar6;
  ulong uVar7;
  IRRef1 *pIVar8;
  cTValue *pcVar9;
  uint uVar10;
  IRIns *pIVar11;
  byte bVar12;
  IRIns *pIVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  TValue keyv;
  
  pIVar4 = (J->cur).ir;
  pIVar13 = pIVar4 + xref;
  uVar7 = (ulong)(J->fold).ins.field_1.o;
  pIVar8 = J->chain + uVar7 + 8;
  while( true ) {
    uVar15 = (uint)*pIVar8;
    uVar14 = (uint)*pIVar8;
    if (uVar14 <= xref) break;
    AVar5 = aa_ahref(J,pIVar13,pIVar4 + pIVar4[uVar14].field_0.op1);
    uVar10 = uVar15;
    if (AVar5 == ALIAS_MAY) goto LAB_001233cd;
    if (AVar5 == ALIAS_MUST) {
      return (uint)(&pIVar4->field_0)[uVar14].op2;
    }
    pIVar8 = &(&pIVar4->field_0)[uVar14].prev;
  }
  pIVar11 = pIVar13;
  if (((pIVar13->field_1).o & 0xfe) == 0x38) {
    pIVar11 = pIVar4 + (pIVar13->field_0).op1;
  }
  uVar3 = (pIVar11->field_0).op1;
  cVar1 = *(char *)((long)pIVar4 + (ulong)uVar3 * 8 + 5);
  uVar10 = xref;
  if ((cVar1 == 'Q') || ((cVar1 == 'R' && (-1 < (short)(pIVar13->field_0).op2)))) {
    if ((pIVar13->field_1).o != 0x38) {
LAB_0012339c:
      do {
        if (uVar15 <= uVar3) goto LAB_0012340d;
        uVar16 = (ulong)uVar15;
        AVar5 = aa_ahref(J,pIVar13,pIVar4 + pIVar4[uVar16].field_0.op1);
        if (AVar5 == ALIAS_MAY) goto LAB_001233cd;
        if (AVar5 == ALIAS_MUST) {
          return (uint)*(ushort *)((long)pIVar4 + uVar16 * 8 + 2);
        }
        uVar15 = (uint)*(ushort *)((long)pIVar4 + uVar16 * 8 + 6);
      } while( true );
    }
    pIVar8 = J->chain + 0x3b;
    do {
      uVar2 = *pIVar8;
      if (uVar2 <= uVar3) goto LAB_0012339c;
      pIVar8 = &(&pIVar4->field_0)[uVar2].prev;
    } while ((*(byte *)((long)pIVar4 + (ulong)(&pIVar4->field_0)[uVar2].op2 * 8 + 4) & 0x1f) != 0xe)
    ;
  }
LAB_001233cd:
  pIVar8 = J->chain + uVar7;
  do {
    uVar3 = *pIVar8;
    if (uVar3 <= uVar10) {
      return 0;
    }
    pIVar8 = &pIVar4[uVar3].field_0.prev;
  } while (pIVar4[uVar3].field_0.op1 != xref);
  return (uint)uVar3;
LAB_0012340d:
  bVar12 = (J->fold).ins.field_1.t.irt & 0x1f;
  if (cVar1 == 'Q') {
    if (bVar12 != 0) {
      return 0;
    }
    bVar12 = 0;
  }
  else if (2 < bVar12) {
    if ((bVar12 == 0xe) || (bVar12 == 4)) {
      pIVar13 = pIVar4 + (pIVar13->field_0).op2;
      if ((pIVar13->field_1).o == '\x1e') {
        pIVar13 = pIVar4 + (pIVar13->field_0).op1;
      }
      lj_ir_kvalue(J->L,&keyv,pIVar13);
      pcVar9 = lj_tab_get(J->L,(GCtab *)(J->cur).ir[(ulong)pIVar4[uVar3].field_0.op1 + 1],&keyv);
      if (((J->fold).ins.field_1.t.irt & 0x1f) == 0xe) {
        TVar6 = lj_ir_knum_u64(J,pcVar9->u64);
        return TVar6;
      }
      TVar6 = lj_ir_kgc(J,(GCobj *)(pcVar9->u64 & 0x7fffffffffff),IRT_STR);
      return TVar6;
    }
    goto LAB_001233cd;
  }
  return (uint)bVar12 * 0x1000001 ^ 0x7fff;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if (ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      if (ir->o == IR_TNEW && !irt_isnil(fins->t))
	return 0;  /* Type instability in loop-carried dependency. */
      if (irt_ispri(fins->t)) {
	return TREF_PRI(irt_type(fins->t));
      } else if (irt_isnum(fins->t) || (LJ_DUALNUM && irt_isint(fins->t)) ||
		 irt_isstr(fins->t)) {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	lj_assertJ(itype2irt(tv) == irt_type(fins->t),
		   "mismatched type in constant table");
	if (irt_isnum(fins->t))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (LJ_DUALNUM && irt_isint(fins->t))
	  return lj_ir_kint(J, intV(tv));
	else
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}